

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

bool __thiscall adios2::query::BlockHit::applyIntersection(BlockHit *this,BlockHit *tmp)

{
  bool bVar1;
  const_iterator box2;
  size_type sVar2;
  long *in_RSI;
  type in_RDI;
  Box<Dims> curr;
  iterator it;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range2;
  bool overlapped;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  in_stack_ffffffffffffff40;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8 [2];
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_78;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_70 [7];
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_38;
  Box<Dims> *box1;
  bool local_1;
  
  if ((((_Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
         *)&in_RDI->first)->_M_impl).super__Vector_impl_data._M_start == (pointer)*in_RSI) {
    bVar1 = isLocalArrayBlock((BlockHit *)0xd27bb9);
    if ((bVar1) || (bVar1 = isLocalArrayBlock((BlockHit *)0xd27bca), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
      box1 = (Box<Dims> *)(in_RSI + 1);
      box2 = std::
             vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::begin((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)in_RDI);
      local_38 = (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)std::
                    vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::end((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_RDI);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                 *)in_stack_ffffffffffffff40._M_current,
                                (__normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                 *)in_RDI), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::operator*((__normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)&stack0xffffffffffffffd0);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::pair(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        local_70[0]._M_current =
             (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::begin((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)in_RDI);
        while( true ) {
          local_78 = (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)std::
                        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        ::end((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               *)in_RDI);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              *)in_stack_ffffffffffffff40._M_current,
                             (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              *)in_RDI);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::operator*(local_70);
          QueryBase::GetIntersection(box1,box2._M_current);
          sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_a8);
          if (sVar2 != 0) {
            local_1 = true;
            __gnu_cxx::
            __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::operator*(local_70);
            std::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator=(in_stack_ffffffffffffff40._M_current,in_RDI);
          }
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(in_stack_ffffffffffffff40._M_current);
          in_stack_ffffffffffffff40 =
               __gnu_cxx::
               __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator++(in_stack_ffffffffffffff48,
                            (int)((ulong)in_stack_ffffffffffffff40._M_current >> 0x20));
        }
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(in_stack_ffffffffffffff40._M_current);
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::operator++((__normal_iterator<const_std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&stack0xffffffffffffffd0);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BlockHit::applyIntersection(const BlockHit &tmp)
{
    if (m_ID != tmp.m_ID)
        return false;

    // local array, no subblock info
    if (isLocalArrayBlock() || tmp.isLocalArrayBlock())
        return true;

    // check subblocks:
    bool overlapped = false;
    for (auto b : tmp.m_Regions)
    {
        for (auto it = m_Regions.begin(); it != m_Regions.end(); it++)
        {
            adios2::Box<Dims> curr = QueryBase::GetIntersection(*it, b);
            if (curr.first.size() != 0) // has intersection
            {
                overlapped = true;
                *it = curr;
            }
        }
    }

    return overlapped;
}